

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::ProcessSecondChanceBoundary(LinearScan *this,BranchInstr *branchInstr)

{
  RegNum RVar1;
  ushort uVar2;
  Kind KVar3;
  LabelInstr *pLVar4;
  long *plVar5;
  long lVar6;
  undefined1 auVar7 [8];
  code *pcVar8;
  SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar9;
  bool bVar10;
  BOOLEAN BVar11;
  BOOL BVar12;
  undefined4 *puVar13;
  Type *ppLVar14;
  MultiBranchInstr *pMVar15;
  long *plVar16;
  Type_conflict pBVar17;
  char *message;
  long lVar18;
  char *error;
  ulong uVar19;
  uint lineNumber;
  Type_conflict pBVar20;
  BranchDictionary *branchDictionary;
  int iVar21;
  undefined1 auStack_68 [8];
  Iterator __iter;
  
  BVar12 = Func::HasTry(this->func);
  if ((BVar12 != 0) && (bVar10 = Func::DoOptimizeTry(this->func), !bVar10)) {
    return;
  }
  pSVar9 = __iter.list;
  if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
     ((BranchInstr *)this->currentOpHelperBlock->opHelperEndInstr == branchInstr)) {
    auStack_68 = (undefined1  [8])this->opHelperSpilledLiveranges;
    __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)auStack_68;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if (__iter.list == (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar10) goto LAB_00585c27;
        *puVar13 = 0;
      }
      __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
                    ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      pSVar9 = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if ((undefined1  [8])__iter.list == auStack_68) break;
      ppLVar14 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)auStack_68);
      uVar2 = *(ushort *)&(*ppLVar14)->field_0x9c;
      if ((uVar2 & 0x40) == 0) {
        if ((uVar2 >> 9 & 1) != 0) {
          RVar1 = (*ppLVar14)->reg;
          BVUnitT<unsigned_long>::AssertRange((uint)RVar1);
          (this->secondChanceRegs).word =
               (this->secondChanceRegs).word | 1L << (RVar1 & (RegXMM15|RegXMM14));
        }
        this->regContent[(*ppLVar14)->reg] = *ppLVar14;
      }
    }
  }
  __iter.list = pSVar9;
  pLVar4 = branchInstr->m_branchTarget;
  if (pLVar4 == (LabelInstr *)0x0) {
    if (branchInstr->m_isMultiBranch == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_005859d7;
    }
  }
  else if (branchInstr->m_isMultiBranch != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_005859d7:
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                        ,lineNumber,error,message);
    if (!bVar10) goto LAB_00585c27;
    *puVar13 = 0;
  }
  if (pLVar4 == (LabelInstr *)0x0) {
    pMVar15 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
    __iter.current = (NodeBase *)((pMVar15->super_BranchInstr).super_Instr.m_func)->m_alloc;
    auStack_68 = (undefined1  [8])0x0;
    __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    plVar5 = (long *)pMVar15->m_branchTargets;
    if (plVar5 != (long *)0x0) {
      KVar3 = pMVar15->m_kind;
      if ((KVar3 == IntJumpTable) || (KVar3 == SingleCharStrJumpTable)) {
        plVar16 = plVar5 + 1;
        lVar18 = pMVar15->m_baseCaseValue;
        if (lVar18 <= pMVar15->m_lastCaseValue) {
          lVar6 = *plVar5;
          do {
            pLVar4 = *(LabelInstr **)(lVar6 + pMVar15->m_baseCaseValue * -8 + lVar18 * 8);
            BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                               ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar4->m_id);
            if (BVar11 == '\0') {
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar4->m_id);
              ProcessSecondChanceBoundaryHelper(this,branchInstr,pLVar4);
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 <= pMVar15->m_lastCaseValue);
        }
      }
      else {
        if (KVar3 != StrDictionary) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                     ,0x435,"(false)","false");
LAB_00585c27:
          pcVar8 = (code *)invalidInstructionException();
          (*pcVar8)();
        }
        plVar16 = plVar5 + 7;
        if (*(int *)((long)plVar5 + 0x1c) != 0) {
          uVar19 = 0;
          do {
            iVar21 = *(int *)(*plVar5 + uVar19 * 4);
            while (iVar21 != -1) {
              lVar18 = (long)iVar21;
              iVar21 = *(int *)(plVar5[1] + 8 + lVar18 * 0x18);
              pLVar4 = *(LabelInstr **)(plVar5[1] + lVar18 * 0x18);
              BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                                 ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar4->m_id);
              if (BVar11 == '\0') {
                BVSparse<Memory::JitArenaAllocator>::Set
                          ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar4->m_id);
                ProcessSecondChanceBoundaryHelper(this,branchInstr,pLVar4);
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < *(uint *)((long)plVar5 + 0x1c));
        }
      }
      pLVar4 = (LabelInstr *)*plVar16;
      BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar4->m_id);
      if (BVar11 == '\0') {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)auStack_68,pLVar4->m_id);
        ProcessSecondChanceBoundaryHelper(this,branchInstr,pLVar4);
      }
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      auVar7 = auStack_68;
      pBVar20 = (Type_conflict)__iter.current[0x10].next;
      do {
        pBVar17 = (Type_conflict)auVar7;
        auVar7 = (undefined1  [8])
                 (((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&pBVar17->next)->
                 super_SListNodeBase<Memory::ArenaAllocator>).next;
        (((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&pBVar17->next)->
        super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)pBVar20;
        pBVar20 = pBVar17;
      } while (auVar7 != (undefined1  [8])0x0);
      __iter.list = (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      __iter.current[0x10].next = (Type)pBVar17;
    }
  }
  else {
    ProcessSecondChanceBoundaryHelper(this,branchInstr,branchInstr->m_branchTarget);
  }
  SaveRegContent(this,&branchInstr->super_Instr);
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundary(IR::BranchInstr *branchInstr)
{
    if (this->func->HasTry() && !this->func->DoOptimizeTry())
    {
        return;
    }

    if (this->currentOpHelperBlock && this->currentOpHelperBlock->opHelperEndInstr == branchInstr)
    {
        // Lifetimes opHelperSpilled won't get recorded by SaveRegContent().  Do it here.
        FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
        {
            if (!lifetime->cantOpHelperSpill)
            {
                if (lifetime->isSecondChanceAllocated)
                {
                    this->secondChanceRegs.Set(lifetime->reg);
                }
                this->regContent[lifetime->reg] = lifetime;
            }
        } NEXT_SLIST_ENTRY;
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->MapUniqueMultiBrLabels([=](IR::LabelInstr * branchLabel) -> void
        {
            this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
        });
    }
    else
    {
        IR::LabelInstr *branchLabel = branchInstr->GetTarget();
        this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
    }

    this->SaveRegContent(branchInstr);
}